

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::DeserializePropertyIdArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto,FunctionBody *functionBody)

{
  byte bVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  PropertyId PVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar2 = *(uint *)buffer;
  uVar13 = *(uint *)(buffer + 5);
  bVar1 = buffer[9];
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < (ulong)uVar2 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1220,
                                "(serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength()"
                               );
    if (!bVar4) goto LAB_007c732f;
    *puVar7 = 0;
  }
  uVar12 = (ulong)bVar1;
  pbVar8 = ByteBlock::GetBuffer(deserializeInto);
  uVar10 = (ulong)*(uint *)buffer;
  *(uint *)(pbVar8 + uVar10) = uVar13;
  pbVar8[uVar10 + 4] = bVar1;
  uVar2 = *(uint *)buffer;
  uVar9 = bVar1 + uVar13;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < (ulong)uVar2 + (ulong)uVar9 * 4 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1224,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar4) {
LAB_007c732f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pbVar8[uVar10 + 5] = buffer[10];
  pbVar8[uVar10 + 6] = buffer[0xb];
  uVar14 = 0;
  uVar11 = 0;
  if (0 < (int)uVar13) {
    uVar11 = (ulong)uVar13;
  }
  for (; uVar11 != uVar14; uVar14 = uVar14 + 1) {
    PVar6 = ByteCodeCache::LookupPropertyId
                      (functionBody->byteCodeCache,*(PropertyId *)(buffer + uVar14 * 4 + 0xc));
    *(PropertyId *)(pbVar8 + uVar14 * 4 + uVar10 + 8) = PVar6;
  }
  while (bVar4 = uVar12 != 0, uVar12 = uVar12 - 1, bVar4) {
    *(undefined4 *)(pbVar8 + (long)(int)uVar13 * 4 + uVar10 + 8) =
         *(undefined4 *)(buffer + (long)(int)uVar13 * 4 + 0xc);
    uVar13 = uVar13 + 1;
  }
  return buffer + (long)(int)uVar9 * 4 + 0xc;
}

Assistant:

const byte *
    DeserializePropertyIdArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto, FunctionBody * functionBody)
    {
        auto serialized = (serialization_alignment const Js::SerializedPropertyIdArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxPropIdArray);
#endif
        auto propertyCount = serialized->propertyCount;
        auto extraSlotCount = serialized->extraSlots;

        Assert(serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength());
        auto result = (PropertyIdArray *)(deserializeInto->GetBuffer() + serialized->offset);
        result->count = propertyCount;
        result->extraSlots = extraSlotCount;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());
        result->hadDuplicates = serialized->hadDuplicates;
        result->has__proto__ = serialized->has__proto__;

        auto elements = (PropertyId*)(serialized + 1);
        for(int i=0;i<propertyCount;++i)
        {
            result->elements[i] = functionBody->GetByteCodeCache()->LookupPropertyId(elements[i]);
        }
        for(int i=0;i<extraSlotCount;++i)
        {
            result->elements[propertyCount + i] = elements[propertyCount + i];
        }
        auto current = buffer +
            sizeof(serialization_alignment const Js::SerializedPropertyIdArray) + (propertyCount + extraSlotCount) * sizeof(PropertyId);
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxPropIdArray);
#endif
        return current;
    }